

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2
               (uint16_t *dst,int dst_stride,CONV_BUF_TYPE *src0,int src0_stride,CONV_BUF_TYPE *src1
               ,int src1_stride,uint8_t *mask,int mask_stride,int h,__m256i *round_offset,int shift,
               __m256i *clip_low,__m256i *clip_high,__m256i *mask_max)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong *in_stack_00000008;
  undefined4 in_stack_00000024;
  __m256i mask0a;
  __m128i mask0b8;
  __m128i mask0a8;
  int in_stack_000002cc;
  CONV_BUF_TYPE *in_stack_000002d0;
  int in_stack_000002dc;
  CONV_BUF_TYPE *in_stack_000002e0;
  int in_stack_000002ec;
  uint16_t *in_stack_000002f0;
  undefined4 in_stack_fffffffffffffe9c;
  __m256i *in_stack_fffffffffffffeb8;
  __m256i local_140;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_dc;
  long local_d8;
  int local_cc;
  long local_c8;
  int local_bc;
  long local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  ulong local_80;
  ulong local_78;
  undefined1 local_70 [16];
  ulong local_60;
  ulong local_58;
  
  local_dc = in_R9D;
  local_d8 = in_R8;
  local_cc = in_ECX;
  local_c8 = in_RDX;
  local_bc = in_ESI;
  local_b8 = in_RDI;
  do {
    local_58 = *in_stack_00000008;
    local_60 = *(ulong *)((long)in_stack_00000008 + (long)(int)mask);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_60;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_58;
    local_70 = vpunpcklqdq_avx(auVar1,auVar3);
    local_f0 = local_70._0_8_;
    uStack_e8 = local_70._8_8_;
    local_78 = *(ulong *)((long)in_stack_00000008 + (long)((int)mask * 2));
    local_80 = *(ulong *)((long)in_stack_00000008 + (long)((int)mask * 3));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_80;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_78;
    local_90 = vpunpcklqdq_avx(auVar2,auVar4);
    local_100 = local_90._0_8_;
    uStack_f8 = local_90._8_8_;
    local_a0 = local_70._0_8_;
    uStack_98 = local_70._8_8_;
    local_120 = vpmovzxbw_avx2(local_70);
    local_b0 = local_90._0_8_;
    uStack_a8 = local_90._8_8_;
    local_140 = (__m256i)vpmovzxbw_avx2(local_90);
    highbd_blend_a64_d16_mask_w8_avx2
              (in_stack_000002f0,in_stack_000002ec,in_stack_000002e0,in_stack_000002dc,
               in_stack_000002d0,in_stack_000002cc,&local_140,
               (__m256i *)CONCAT44(in_stack_00000024,h),
               (__m256i *)CONCAT44(in_stack_fffffffffffffe9c,round_offset._0_4_),shift,clip_low,
               clip_high,in_stack_fffffffffffffeb8);
    local_b8 = local_b8 + (long)(local_bc << 2) * 2;
    local_c8 = local_c8 + (long)(local_cc << 2) * 2;
    local_d8 = local_d8 + (long)(local_dc << 2) * 2;
    in_stack_00000008 = (ulong *)((long)in_stack_00000008 + (long)((int)mask << 2));
    mask_stride = mask_stride + -4;
  } while (mask_stride != 0);
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_subw0_subh0_w8_avx2(
    uint16_t *dst, int dst_stride, const CONV_BUF_TYPE *src0, int src0_stride,
    const CONV_BUF_TYPE *src1, int src1_stride, const uint8_t *mask,
    int mask_stride, int h, const __m256i *round_offset, int shift,
    const __m256i *clip_low, const __m256i *clip_high,
    const __m256i *mask_max) {
  do {
    // Load 8x u8 pixels from each of 4 rows in the mask
    const __m128i mask0a8 =
        _mm_set_epi64x(*(int64_t *)mask, *(uint64_t *)(mask + mask_stride));
    const __m128i mask0b8 =
        _mm_set_epi64x(*(int64_t *)(mask + 2 * mask_stride),
                       *(int64_t *)(mask + 3 * mask_stride));
    const __m256i mask0a = _mm256_cvtepu8_epi16(mask0a8);
    const __m256i mask0b = _mm256_cvtepu8_epi16(mask0b8);

    highbd_blend_a64_d16_mask_w8_avx2(
        dst, dst_stride, src0, src0_stride, src1, src1_stride, &mask0a, &mask0b,
        round_offset, shift, clip_low, clip_high, mask_max);

    dst += dst_stride * 4;
    src0 += src0_stride * 4;
    src1 += src1_stride * 4;
    mask += mask_stride * 4;
  } while (h -= 4);
}